

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O0

void __thiscall
despot::Planner::Planner
          (Planner *this,string *lower_bounds_str,string *base_lower_bounds_str,
          string *upper_bounds_str,string *base_upper_bounds_str)

{
  string local_c0;
  string local_a0;
  string local_70;
  string local_50;
  string *local_30;
  string *base_upper_bounds_str_local;
  string *upper_bounds_str_local;
  string *base_lower_bounds_str_local;
  string *lower_bounds_str_local;
  Planner *this_local;
  
  local_30 = base_upper_bounds_str;
  base_upper_bounds_str_local = upper_bounds_str;
  upper_bounds_str_local = base_lower_bounds_str;
  base_lower_bounds_str_local = lower_bounds_str;
  lower_bounds_str_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)lower_bounds_str);
  std::__cxx11::string::string((string *)&local_70,(string *)base_lower_bounds_str);
  std::__cxx11::string::string((string *)&local_a0,(string *)upper_bounds_str);
  std::__cxx11::string::string((string *)&local_c0,(string *)base_upper_bounds_str);
  PlannerBase::PlannerBase(&this->super_PlannerBase,&local_50,&local_70,&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_PlannerBase)._vptr_PlannerBase = (_func_int **)&PTR__Planner_0026e6a8;
  this->step_ = 0;
  this->round_ = 0;
  return;
}

Assistant:

Planner::Planner(string lower_bounds_str,
		string base_lower_bounds_str, string upper_bounds_str, string base_upper_bounds_str)
		:PlannerBase(lower_bounds_str, base_lower_bounds_str, upper_bounds_str, base_upper_bounds_str){
	step_=0;
	round_=0;
}